

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O1

vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *
puppup::movegen::genFromBoard
          (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
           *__return_storage_ptr__,Gaddag *gaddag,bool param_3)

{
  idx i;
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  idx i_1;
  undefined1 *puVar6;
  long step;
  undefined8 *puVar7;
  long lVar8;
  char *pcVar9;
  long r;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  long in_stack_00000080;
  long in_stack_00000088;
  long in_stack_00000090;
  long in_stack_00000098;
  long in_stack_000000a0;
  long in_stack_000000a8;
  long in_stack_000000b0;
  long in_stack_000000b8;
  long in_stack_000000c0;
  long in_stack_000000c8;
  long in_stack_000000d0;
  long in_stack_000000d8;
  long in_stack_000000e0;
  long in_stack_000000e8;
  long in_stack_000000f0;
  long in_stack_000000f8;
  long in_stack_00000100;
  array<long,_16384UL> orthogonal_memo;
  undefined1 auStack_22278 [16];
  pointer pMStack_22268;
  long lStack_22260;
  undefined1 *puStack_22258;
  undefined8 uStack_22250;
  char acStack_22248 [256];
  Rack RStack_22148;
  undefined8 auStack_22040 [257];
  undefined1 auStack_21838 [2048];
  State SStack_21038;
  array<long,_16384UL> aStack_20030;
  
  acStack_22248[0xc0] = '\0';
  acStack_22248[0xc1] = '\0';
  acStack_22248[0xc2] = '\0';
  acStack_22248[0xc3] = '\0';
  acStack_22248[0xc4] = '\0';
  acStack_22248[0xc5] = '\0';
  acStack_22248[0xc6] = '\0';
  acStack_22248[199] = '\0';
  acStack_22248[200] = '\0';
  acStack_22248[0xc9] = '\0';
  acStack_22248[0xca] = '\0';
  acStack_22248[0xcb] = '\0';
  acStack_22248[0xcc] = '\0';
  acStack_22248[0xcd] = '\0';
  acStack_22248[0xce] = '\0';
  acStack_22248[0xcf] = '\0';
  acStack_22248[0xd0] = '\0';
  acStack_22248[0xd1] = '\0';
  acStack_22248[0xd2] = '\0';
  acStack_22248[0xd3] = '\0';
  acStack_22248[0xd4] = '\0';
  acStack_22248[0xd5] = '\0';
  acStack_22248[0xd6] = '\0';
  acStack_22248[0xd7] = '\0';
  acStack_22248[0xd8] = '\0';
  acStack_22248[0xd9] = '\0';
  acStack_22248[0xda] = '\0';
  acStack_22248[0xdb] = '\0';
  acStack_22248[0xdc] = '\0';
  acStack_22248[0xdd] = '\0';
  acStack_22248[0xde] = '\0';
  acStack_22248[0xdf] = '\0';
  acStack_22248[0xe0] = '\0';
  acStack_22248[0xe1] = '\0';
  acStack_22248[0xe2] = '\0';
  acStack_22248[0xe3] = '\0';
  acStack_22248[0xe4] = '\0';
  acStack_22248[0xe5] = '\0';
  acStack_22248[0xe6] = '\0';
  acStack_22248[0xe7] = '\0';
  acStack_22248[0xe8] = '\0';
  acStack_22248[0xe9] = '\0';
  acStack_22248[0xea] = '\0';
  acStack_22248[0xeb] = '\0';
  acStack_22248[0xec] = '\0';
  acStack_22248[0xed] = '\0';
  acStack_22248[0xee] = '\0';
  acStack_22248[0xef] = '\0';
  acStack_22248[0xf0] = '\0';
  acStack_22248[0xf1] = '\0';
  acStack_22248[0xf2] = '\0';
  acStack_22248[0xf3] = '\0';
  acStack_22248[0xf4] = '\0';
  acStack_22248[0xf5] = '\0';
  acStack_22248[0xf6] = '\0';
  acStack_22248[0xf7] = '\0';
  acStack_22248[0xf8] = '\0';
  acStack_22248[0xf9] = '\0';
  acStack_22248[0xfa] = '\0';
  acStack_22248[0xfb] = '\0';
  acStack_22248[0xfc] = '\0';
  acStack_22248[0xfd] = '\0';
  acStack_22248[0xfe] = '\0';
  acStack_22248[0xff] = '\0';
  acStack_22248[0x80] = '\0';
  acStack_22248[0x81] = '\0';
  acStack_22248[0x82] = '\0';
  acStack_22248[0x83] = '\0';
  acStack_22248[0x84] = '\0';
  acStack_22248[0x85] = '\0';
  acStack_22248[0x86] = '\0';
  acStack_22248[0x87] = '\0';
  acStack_22248[0x88] = '\0';
  acStack_22248[0x89] = '\0';
  acStack_22248[0x8a] = '\0';
  acStack_22248[0x8b] = '\0';
  acStack_22248[0x8c] = '\0';
  acStack_22248[0x8d] = '\0';
  acStack_22248[0x8e] = '\0';
  acStack_22248[0x8f] = '\0';
  acStack_22248[0x90] = '\0';
  acStack_22248[0x91] = '\0';
  acStack_22248[0x92] = '\0';
  acStack_22248[0x93] = '\0';
  acStack_22248[0x94] = '\0';
  acStack_22248[0x95] = '\0';
  acStack_22248[0x96] = '\0';
  acStack_22248[0x97] = '\0';
  acStack_22248[0x98] = '\0';
  acStack_22248[0x99] = '\0';
  acStack_22248[0x9a] = '\0';
  acStack_22248[0x9b] = '\0';
  acStack_22248[0x9c] = '\0';
  acStack_22248[0x9d] = '\0';
  acStack_22248[0x9e] = '\0';
  acStack_22248[0x9f] = '\0';
  acStack_22248[0xa0] = '\0';
  acStack_22248[0xa1] = '\0';
  acStack_22248[0xa2] = '\0';
  acStack_22248[0xa3] = '\0';
  acStack_22248[0xa4] = '\0';
  acStack_22248[0xa5] = '\0';
  acStack_22248[0xa6] = '\0';
  acStack_22248[0xa7] = '\0';
  acStack_22248[0xa8] = '\0';
  acStack_22248[0xa9] = '\0';
  acStack_22248[0xaa] = '\0';
  acStack_22248[0xab] = '\0';
  acStack_22248[0xac] = '\0';
  acStack_22248[0xad] = '\0';
  acStack_22248[0xae] = '\0';
  acStack_22248[0xaf] = '\0';
  acStack_22248[0xb0] = '\0';
  acStack_22248[0xb1] = '\0';
  acStack_22248[0xb2] = '\0';
  acStack_22248[0xb3] = '\0';
  acStack_22248[0xb4] = '\0';
  acStack_22248[0xb5] = '\0';
  acStack_22248[0xb6] = '\0';
  acStack_22248[0xb7] = '\0';
  acStack_22248[0xb8] = '\0';
  acStack_22248[0xb9] = '\0';
  acStack_22248[0xba] = '\0';
  acStack_22248[0xbb] = '\0';
  acStack_22248[0xbc] = '\0';
  acStack_22248[0xbd] = '\0';
  acStack_22248[0xbe] = '\0';
  acStack_22248[0xbf] = '\0';
  acStack_22248[0x40] = '\0';
  acStack_22248[0x41] = '\0';
  acStack_22248[0x42] = '\0';
  acStack_22248[0x43] = '\0';
  acStack_22248[0x44] = '\0';
  acStack_22248[0x45] = '\0';
  acStack_22248[0x46] = '\0';
  acStack_22248[0x47] = '\0';
  acStack_22248[0x48] = '\0';
  acStack_22248[0x49] = '\0';
  acStack_22248[0x4a] = '\0';
  acStack_22248[0x4b] = '\0';
  acStack_22248[0x4c] = '\0';
  acStack_22248[0x4d] = '\0';
  acStack_22248[0x4e] = '\0';
  acStack_22248[0x4f] = '\0';
  acStack_22248[0x50] = '\0';
  acStack_22248[0x51] = '\0';
  acStack_22248[0x52] = '\0';
  acStack_22248[0x53] = '\0';
  acStack_22248[0x54] = '\0';
  acStack_22248[0x55] = '\0';
  acStack_22248[0x56] = '\0';
  acStack_22248[0x57] = '\0';
  acStack_22248[0x58] = '\0';
  acStack_22248[0x59] = '\0';
  acStack_22248[0x5a] = '\0';
  acStack_22248[0x5b] = '\0';
  acStack_22248[0x5c] = '\0';
  acStack_22248[0x5d] = '\0';
  acStack_22248[0x5e] = '\0';
  acStack_22248[0x5f] = '\0';
  acStack_22248[0x60] = '\0';
  acStack_22248[0x61] = '\0';
  acStack_22248[0x62] = '\0';
  acStack_22248[99] = '\0';
  acStack_22248[100] = '\0';
  acStack_22248[0x65] = '\0';
  acStack_22248[0x66] = '\0';
  acStack_22248[0x67] = '\0';
  acStack_22248[0x68] = '\0';
  acStack_22248[0x69] = '\0';
  acStack_22248[0x6a] = '\0';
  acStack_22248[0x6b] = '\0';
  acStack_22248[0x6c] = '\0';
  acStack_22248[0x6d] = '\0';
  acStack_22248[0x6e] = '\0';
  acStack_22248[0x6f] = '\0';
  acStack_22248[0x70] = '\0';
  acStack_22248[0x71] = '\0';
  acStack_22248[0x72] = '\0';
  acStack_22248[0x73] = '\0';
  acStack_22248[0x74] = '\0';
  acStack_22248[0x75] = '\0';
  acStack_22248[0x76] = '\0';
  acStack_22248[0x77] = '\0';
  acStack_22248[0x78] = '\0';
  acStack_22248[0x79] = '\0';
  acStack_22248[0x7a] = '\0';
  acStack_22248[0x7b] = '\0';
  acStack_22248[0x7c] = '\0';
  acStack_22248[0x7d] = '\0';
  acStack_22248[0x7e] = '\0';
  acStack_22248[0x7f] = '\0';
  acStack_22248[0] = '\0';
  acStack_22248[1] = '\0';
  acStack_22248[2] = '\0';
  acStack_22248[3] = '\0';
  acStack_22248[4] = '\0';
  acStack_22248[5] = '\0';
  acStack_22248[6] = '\0';
  acStack_22248[7] = '\0';
  acStack_22248[8] = '\0';
  acStack_22248[9] = '\0';
  acStack_22248[10] = '\0';
  acStack_22248[0xb] = '\0';
  acStack_22248[0xc] = '\0';
  acStack_22248[0xd] = '\0';
  acStack_22248[0xe] = '\0';
  acStack_22248[0xf] = '\0';
  acStack_22248[0x10] = '\0';
  acStack_22248[0x11] = '\0';
  acStack_22248[0x12] = '\0';
  acStack_22248[0x13] = '\0';
  acStack_22248[0x14] = '\0';
  acStack_22248[0x15] = '\0';
  acStack_22248[0x16] = '\0';
  acStack_22248[0x17] = '\0';
  acStack_22248[0x18] = '\0';
  acStack_22248[0x19] = '\0';
  acStack_22248[0x1a] = '\0';
  acStack_22248[0x1b] = '\0';
  acStack_22248[0x1c] = '\0';
  acStack_22248[0x1d] = '\0';
  acStack_22248[0x1e] = '\0';
  acStack_22248[0x1f] = '\0';
  acStack_22248[0x20] = '\0';
  acStack_22248[0x21] = '\0';
  acStack_22248[0x22] = '\0';
  acStack_22248[0x23] = '\0';
  acStack_22248[0x24] = '\0';
  acStack_22248[0x25] = '\0';
  acStack_22248[0x26] = '\0';
  acStack_22248[0x27] = '\0';
  acStack_22248[0x28] = '\0';
  acStack_22248[0x29] = '\0';
  acStack_22248[0x2a] = '\0';
  acStack_22248[0x2b] = '\0';
  acStack_22248[0x2c] = '\0';
  acStack_22248[0x2d] = '\0';
  acStack_22248[0x2e] = '\0';
  acStack_22248[0x2f] = '\0';
  acStack_22248[0x30] = '\0';
  acStack_22248[0x31] = '\0';
  acStack_22248[0x32] = '\0';
  acStack_22248[0x33] = '\0';
  acStack_22248[0x34] = '\0';
  acStack_22248[0x35] = '\0';
  acStack_22248[0x36] = '\0';
  acStack_22248[0x37] = '\0';
  acStack_22248[0x38] = '\0';
  acStack_22248[0x39] = '\0';
  acStack_22248[0x3a] = '\0';
  acStack_22248[0x3b] = '\0';
  acStack_22248[0x3c] = '\0';
  acStack_22248[0x3d] = '\0';
  acStack_22248[0x3e] = '\0';
  acStack_22248[0x3f] = '\0';
  lVar1 = 0;
  do {
    if (*(long *)(&stack0x00000110 + lVar1 * 8) != 0x1b) {
      *(undefined1 *)((long)&puStack_22258 + lVar1) = 1;
      acStack_22248[lVar1 + 0x10] = '\x01';
      *(undefined1 *)((long)&uStack_22250 + lVar1 + 7) = 1;
      acStack_22248[lVar1 + 1] = '\x01';
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf0);
  plVar2 = &board::word_multiplier;
  lVar1 = 0;
  do {
    if ((((~(uint)lVar1 & 0xf) == 0) || (*(long *)(&stack0x00000110 + lVar1 * 8) != 0x1b)) ||
       (*plVar2 == 0)) {
      acStack_22248[lVar1] = '\0';
    }
    lVar1 = lVar1 + 1;
    plVar2 = plVar2 + 1;
  } while (lVar1 != 0xf0);
  auStack_22278 = ZEXT416(0) << 0x40;
  pMStack_22268 = (pointer)0x0;
  SStack_21038.score = 0x1000000001;
  puStack_22258 = &stack0x00000110;
  lVar1 = 0;
  lStack_22260 = 0;
  do {
    lVar3 = (long)*(int *)((long)SStack_21038.board._M_elems + lVar1 + -8);
    lVar4 = 0;
    do {
      *(undefined8 *)((long)aStack_20030._M_elems + lVar4) = 0xfffffffffffffffe;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20000);
    lVar8 = lVar3 * -2;
    puVar7 = &board::word_multiplier + -lVar3;
    puVar6 = puStack_22258 + lVar3 * -8;
    pcVar9 = acStack_22248 + -lVar3;
    lVar4 = 0;
    uStack_22250 = lVar1;
    do {
      if (acStack_22248[lVar4] == '\x01') {
        uVar5 = lVar4 - lVar3;
        if (acStack_22248[uVar5] == '\0') {
          if (uVar5 < 0xf1 && (uVar5 & 0x800000000000000f) != 0xf) {
            lVar1 = 0;
            while ((puVar7[lVar1] != 0 && (*(long *)(puVar6 + lVar1 * 8) != 0x1b))) {
              if (pcVar9[lVar1] != '\0') goto LAB_001092d5;
              uVar5 = lVar8 + lVar1;
              if ((0xf0 < uVar5) || (lVar1 = lVar1 - lVar3, (uVar5 & 0x800000000000000f) == 0xf))
              break;
            }
          }
          lVar1 = 0;
          step = -lVar3;
        }
        else {
LAB_001092d5:
          lVar1 = (((gaddag->nodes_).
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
          step = lVar3;
        }
        __impl::gen((Rack *)&stack0x00000008,step,lVar4,lVar4,lVar1,gaddag,(State *)&stack0x00000108
                    ,0,0,1,(vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                           auStack_22278,param_3,&aStack_20030,0,0);
        lStack_22260 = lStack_22260 + 1;
      }
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + 1;
      puVar7 = puVar7 + 1;
      puVar6 = puVar6 + 8;
      pcVar9 = pcVar9 + 1;
    } while (lVar4 != 0xf0);
    lVar1 = uStack_22250 + 4;
    if (lVar1 == 8) {
      if (lStack_22260 == 0) {
        auStack_22040[0] = 0;
        lVar1 = 8;
        do {
          *(undefined8 *)((long)auStack_22040 + lVar1) = 0x1b;
          lVar1 = lVar1 + 8;
        } while (lVar1 != 0x808);
        lVar1 = 0;
        memset(auStack_21838,0,0x800);
        memcpy(&SStack_21038,auStack_22040,0x1008);
        RStack_22148._M_elems[0] = r;
        RStack_22148._M_elems[1] = in_stack_00000010;
        RStack_22148._M_elems[2] = in_stack_00000018;
        RStack_22148._M_elems[3] = in_stack_00000020;
        RStack_22148._M_elems[4] = in_stack_00000028;
        RStack_22148._M_elems[5] = in_stack_00000030;
        RStack_22148._M_elems[6] = in_stack_00000038;
        RStack_22148._M_elems[7] = in_stack_00000040;
        RStack_22148._M_elems[8] = in_stack_00000048;
        RStack_22148._M_elems[9] = in_stack_00000050;
        RStack_22148._M_elems[10] = in_stack_00000058;
        RStack_22148._M_elems[0xb] = in_stack_00000060;
        RStack_22148._M_elems[0xc] = in_stack_00000068;
        RStack_22148._M_elems[0xd] = in_stack_00000070;
        RStack_22148._M_elems[0xe] = in_stack_00000078;
        RStack_22148._M_elems[0xf] = in_stack_00000080;
        RStack_22148._M_elems[0x10] = in_stack_00000088;
        RStack_22148._M_elems[0x11] = in_stack_00000090;
        RStack_22148._M_elems[0x12] = in_stack_00000098;
        RStack_22148._M_elems[0x13] = in_stack_000000a0;
        RStack_22148._M_elems[0x14] = in_stack_000000a8;
        RStack_22148._M_elems[0x15] = in_stack_000000b0;
        RStack_22148._M_elems[0x16] = in_stack_000000b8;
        RStack_22148._M_elems[0x17] = in_stack_000000c0;
        RStack_22148._M_elems[0x18] = in_stack_000000c8;
        RStack_22148._M_elems[0x19] = in_stack_000000d0;
        RStack_22148._M_elems[0x1a] = in_stack_000000d8;
        RStack_22148._M_elems[0x1b] = in_stack_000000e0;
        RStack_22148._M_elems[0x1c] = in_stack_000000e8;
        RStack_22148._M_elems[0x1d] = in_stack_000000f0;
        RStack_22148._M_elems[0x1e] = in_stack_000000f8;
        RStack_22148._M_elems[0x1f] = in_stack_00000100;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do {
          *(undefined8 *)((long)aStack_20030._M_elems + lVar1) = 0xfffffffffffffffe;
          lVar1 = lVar1 + 8;
        } while (lVar1 != 0x20000);
        __impl::gen(&RStack_22148,-1,0x77,0x77,0,gaddag,&SStack_21038,0,0,1,__return_storage_ptr__,
                    false,&aStack_20030,0,0);
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)auStack_22278._0_8_;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)auStack_22278._8_8_;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = pMStack_22268;
        auStack_22278 = ZEXT816(0);
        pMStack_22268 = (pointer)0x0;
      }
      if ((pointer)auStack_22278._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_22278._0_8_,(long)pMStack_22268 - auStack_22278._0_8_);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline std::vector<Move> genFromBoard(Rack r, const trie::Gaddag& gaddag,
                                      board::State state,
                                      const bool best_only = false) {
    std::array<bool, 256> buildable;
    buildable.fill(false);
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness) {
            buildable[i - 16] = true;
            buildable[i + 16] = true;
            buildable[i - 1] = true;
            buildable[i + 1] = true;
        }
    }
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness || __impl::edge(i)) {
            buildable[i] = false;
        }
    }

    std::vector<Move> outputs;
    idx n_buildable = 0;
    for (idx step : {1, 16}) {
        auto orthogonal_memo = constArray<256 * 32 * 2>(-2);
        for (idx i = 0; i < 240; ++i) {
            if (buildable[i]) {
                bool needs_both_directions = false;
                // todo: faster method than this ridiculous O(n^3) one
                if (!buildable[i - step]) {
                    needs_both_directions = true;
                    idx j = i - step;
                    while (!__impl::edge(j) && state.board[j] != emptiness) {
                        if (buildable[j]) {
                            needs_both_directions = false;
                            break;
                        }
                        j -= step;
                    }
                }
                // if (step == 1) std::cerr << "left ";
                // if (step == 16) std::cerr << "down ";
                if (needs_both_directions) {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " with both directions" << std::endl;
                    __impl::gen(r, -step, i, i, 0, gaddag, state, 0, 0, 1,
                                outputs, best_only, orthogonal_memo);
                } else {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " in forward directions" << std::endl;
                    __impl::gen(r, step, i, i, gaddag.get(0, trie::rev_marker),
                                gaddag, state, 0, 0, 1, outputs, best_only,
                                orthogonal_memo);
                }
                ++n_buildable;
            }
        }
    }
    if (!n_buildable) {
        return genFromIdx(r, gaddag);
    }
    // std::cerr << "outputs: " << outputs.size() << std::endl;
    return outputs;
}